

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O3

void type_safe::detail::
     with_union<type_safe::detail::swap_union<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>::visitor&&,type_safe::tagged_union<int,double,debugger_type>&,type_safe::union_types<int,double,debugger_type>,type_safe::tagged_union<int,double,debugger_type>&,type_safe::tagged_union<int,double,debugger_type>&>
     ::with_impl<double,debugger_type>
               (tagged_union<int,_double,_debugger_type> *param_1,visitor *param_2,
               tagged_union<int,_double,_debugger_type> *param_3,
               tagged_union<int,_double,_debugger_type> *param_4)

{
  if ((param_1->cur_type_).
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ == 2) {
    tagged_union<int,_double,_debugger_type>::check<double>(param_1);
    swap_union<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>
    ::visitor::operator()(param_2,(double *)param_1,param_3,param_4);
    return;
  }
  with_union<type_safe::detail::swap_union<type_safe::optional_variant_policy,_type_safe::tagged_union<int,_double,_debugger_type>_>::visitor_&&,_type_safe::tagged_union<int,_double,_debugger_type>_&,_type_safe::union_types<int,_double,_debugger_type>,_type_safe::tagged_union<int,_double,_debugger_type>_&,_type_safe::tagged_union<int,_double,_debugger_type>_&>
  ::with_impl<debugger_type>(param_1,param_2,param_3,param_4);
  return;
}

Assistant:

static void with_impl(union_types<Head, Tail...>, Union&& u, Func&& func, Args&&... args)
        {
            if (u.type() == union_type<Head>{})
                call<Head>(0, std::forward<Union>(u), std::forward<Func>(func),
                           std::forward<Args>(args)...);
            else
                with_impl(union_types<Tail...>{}, std::forward<Union>(u), std::forward<Func>(func),
                          std::forward<Args>(args)...);
        }